

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::
emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
          *this,int *key,size_t hashval,piecewise_construct_t *args,tuple<int_&&> *args_1,
          tuple<int_&&> *args_2)

{
  pthread_mutex_t *__mutex;
  int *piVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  size_t i;
  ctrl_t *pcVar5;
  long lVar6;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  slot_type *psVar7;
  
  lVar6 = (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                  (uint)hashval >> 8 ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x58;
  __mutex = (pthread_mutex_t *)(this + lVar6);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)(this + lVar6 + 0x28);
    sVar4 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::_find_key<int>(this_00,key,hashval);
    if (sVar4 == 0xffffffffffffffff) {
      i = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::prepare_insert(this_00,hashval);
      lVar6 = *(long *)((long)__mutex + 0x30);
      piVar1 = (args_2->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>.
               _M_head_impl;
      *(int *)(lVar6 + i * 8) =
           *(args_1->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>.
            _M_head_impl;
      *(int *)(lVar6 + 4 + i * 8) = *piVar1;
      raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::set_ctrl(this_00,i,(byte)hashval & 0x7f);
      lVar6 = __mutex[1].__align;
      pcVar5 = (ctrl_t *)(lVar6 + i);
      psVar7 = (slot_type *)(i * 8 + *(long *)((long)__mutex + 0x30));
    }
    else {
      lVar6 = __mutex[1].__align;
      pcVar5 = (ctrl_t *)(lVar6 + sVar4);
      psVar7 = (slot_type *)(sVar4 * 8 + *(long *)((long)__mutex + 0x30));
    }
    lVar2 = *(long *)((long)__mutex + 0x40);
    (__return_storage_ptr__->first).inner_ = (Inner *)__mutex;
    (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x580);
    (__return_storage_ptr__->first).it_.ctrl_ = pcVar5;
    (__return_storage_ptr__->first).it_.field_1.slot_ = psVar7;
    (__return_storage_ptr__->first).it_end_.ctrl_ = (ctrl_t *)(lVar6 + lVar2);
    __return_storage_ptr__->second = sVar4 == 0xffffffffffffffff;
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }